

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testInvalid_TargetPredictedFeatureNameAndFakeModelInputs(void)

{
  int iVar1;
  string *psVar2;
  Rep *pRVar3;
  bool bVar4;
  TypeUnion TVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  StringFeatureType *pSVar9;
  DictionaryFeatureType *pDVar10;
  ArrayFeatureType *pAVar11;
  ostream *poVar12;
  int iVar13;
  void **ppvVar14;
  long lVar15;
  long lVar16;
  Model spec;
  string predictedFeatureName;
  string targetName;
  string probsName;
  FeatureDescription feature;
  TensorAttributes tensorAttributesOut;
  Result res;
  TensorAttributes tensorAttributesIn;
  Model local_1d8;
  string local_1a8;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  undefined1 local_138 [32];
  TensorAttributes local_118;
  pointer local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes local_48;
  
  CoreML::Specification::Model::Model(&local_1d8);
  CoreML::Result::Result((Result *)&local_100);
  local_48.name = "InTensor";
  local_48.dimension = 3;
  local_48._12_4_ = 0;
  local_118.name = "OutTensor";
  local_118.dimension = 1;
  local_118._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_1d8,true,&local_48,&local_118,0x400,false,false);
  local_1d8.specificationversion_ = 4;
  if (local_1d8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_1d8);
    local_1d8._oneof_case_[0] = 500;
    TVar5.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar5.neuralnetwork_);
    local_1d8.Type_.pipelineclassifier_ = TVar5.pipelineclassifier_;
  }
  TVar5 = local_1d8.Type_;
  addSoftmaxLayer(&local_1d8,"softmax","OutTensor","softmax_out");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"predictedFeatures","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"probs","");
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1d8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar2 = (pTVar7->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_1a8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 3;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pFVar8->Type_).stringtype_ = pSVar9;
  }
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1d8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar2 = (pTVar7->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_168);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 6;
    pDVar10 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar10);
    (pFVar8->Type_).dictionarytype_ = pDVar10;
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 6;
    pDVar10 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar10);
    (pFVar8->Type_).dictionarytype_ = pDVar10;
  }
  pDVar10 = (pFVar8->Type_).dictionarytype_;
  if (pDVar10->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar10);
    pDVar10->_oneof_case_[0] = 2;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pDVar10->KeyType_).stringkeytype_ = pSVar9;
  }
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  psVar2 = ((local_1d8.description_)->predictedfeaturename_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_1d8.description_)->predictedfeaturename_,&local_1a8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  psVar2 = ((local_1d8.description_)->predictedprobabilitiesname_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_1d8.description_)->predictedprobabilitiesname_,&local_168);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"cce_target","");
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&local_1d8,TVar5.neuralnetwork_,"cross_entropy_loss_layer","softmax_out",
             local_188._M_dataplus._M_p);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar5.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1d8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1d8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  local_148 = (undefined1  [8])local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"madeUpInput","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  if (local_148 != (undefined1  [8])local_138) {
    operator_delete((void *)local_148,local_138._0_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar8->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar8->Type_).multiarraytype_;
  pAVar11->datatype_ = 0x10020;
  iVar13 = 3;
  do {
    iVar1 = (pAVar11->shape_).total_size_;
    if ((pAVar11->shape_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar1 + 1);
    }
    iVar1 = (pAVar11->shape_).current_size_;
    (pAVar11->shape_).current_size_ = iVar1 + 1;
    ((pAVar11->shape_).rep_)->elements[iVar1] = 1;
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1d8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  psVar2 = (pTVar7->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_188);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar8->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar8->Type_).multiarraytype_;
  pAVar11->datatype_ = 0x20020;
  iVar13 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar13) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar13 + 1);
  }
  iVar13 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar13 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar13] = 1;
  if (local_1d8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1d8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1d8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  psVar2 = (pTVar7->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_1a8);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 3;
    pSVar9 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar9);
    (pFVar8->Type_).stringtype_ = pSVar9;
  }
  CoreML::Model::validate((Result *)local_148,&local_1d8);
  local_100 = (pointer)local_148;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_140);
  if (local_140._M_p != local_138 + 8) {
    operator_delete(local_140._M_p,local_138._8_8_ + 1);
  }
  bVar4 = CoreML::Result::good((Result *)&local_100);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x728);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    iVar13 = 1;
    std::ostream::flush();
  }
  else {
    if (local_1d8.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
      local_1d8.description_ = pMVar6;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&((local_1d8.description_)->output_).super_RepeatedPtrFieldBase);
    if (local_1d8.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
      local_1d8.description_ = pMVar6;
    }
    pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&((local_1d8.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0)
    ;
    CoreML::Specification::FeatureDescription::set_name(pTVar7,local_118.name);
    if (pTVar7->type_ == (FeatureType *)0x0) {
      pFVar8 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar8);
      pTVar7->type_ = pFVar8;
    }
    pFVar8 = pTVar7->type_;
    if (pFVar8->_oneof_case_[0] != 5) {
      CoreML::Specification::FeatureType::clear_Type(pFVar8);
      pFVar8->_oneof_case_[0] = 5;
      pAVar11 = (ArrayFeatureType *)operator_new(0x48);
      CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
      (pFVar8->Type_).multiarraytype_ = pAVar11;
    }
    pAVar11 = (pFVar8->Type_).multiarraytype_;
    pAVar11->datatype_ = 0x10020;
    if (0 < local_118.dimension) {
      iVar13 = 0;
      do {
        iVar1 = (pAVar11->shape_).total_size_;
        if ((pAVar11->shape_).current_size_ == iVar1) {
          google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar1 + 1);
        }
        iVar1 = (pAVar11->shape_).current_size_;
        (pAVar11->shape_).current_size_ = iVar1 + 1;
        ((pAVar11->shape_).rep_)->elements[iVar1] = 1;
        iVar13 = iVar13 + 1;
      } while (iVar13 < local_118.dimension);
    }
    pMVar6 = local_1d8.description_;
    if (local_1d8.description_ == (ModelDescription *)0x0) {
      pMVar6 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar3 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar14 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar14 = (void **)0x0;
    }
    lVar15 = (long)(pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar15 != 0) {
      lVar16 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_148,*(FeatureDescription **)((long)ppvVar14 + lVar16)
                  );
        if (local_1d8.description_ == (ModelDescription *)0x0) {
          pMVar6 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
          local_1d8.description_ = pMVar6;
        }
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&((local_1d8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                            (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar7,(FeatureDescription *)local_148);
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_148);
        lVar16 = lVar16 + 8;
      } while (lVar15 * 8 != lVar16);
    }
    CoreML::Model::validate((Result *)local_148,&local_1d8);
    local_100 = (pointer)local_148;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_140);
    if (local_140._M_p != local_138 + 8) {
      operator_delete(local_140._M_p,local_138._8_8_ + 1);
    }
    bVar4 = CoreML::Result::good((Result *)&local_100);
    iVar13 = 0;
    if (!bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x73a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      iVar13 = 1;
      std::ostream::flush();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1d8);
  return iVar13;
}

Assistant:

int testInvalid_TargetPredictedFeatureNameAndFakeModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    // Model is not a classifier, but we'll describe these things in the spec anyway to check this edge-case
    std::string predictedFeatureName = "predictedFeatures";
    std::string probsName = "probs";
    auto *output = spec.mutable_description()->add_output();
    output->set_name(predictedFeatureName);
    output->mutable_type()->mutable_stringtype();

    auto *outputProbs = spec.mutable_description()->add_output();
    outputProbs->set_name(probsName);
    outputProbs->mutable_type()->mutable_dictionarytype();
    outputProbs->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    spec.mutable_description()->set_predictedfeaturename(predictedFeatureName);
    spec.mutable_description()->set_predictedprobabilitiesname(probsName);

    std::string targetName = "cce_target";
    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", targetName.c_str());

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(predictedFeatureName);
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Remove predictedFeatureName from model's outputs and add model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}